

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O1

bool __thiscall
QAbstractItemViewPrivate::dropOn
          (QAbstractItemViewPrivate *this,QDropEvent *event,int *dropRow,int *dropCol,
          QModelIndex *dropIndex)

{
  long *plVar1;
  QWidgetData *pQVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined4 uVar5;
  char cVar6;
  bool bVar7;
  bool bVar8;
  uint uVar9;
  DropIndicatorPosition DVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  long in_FS_OFFSET;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  QModelIndex local_78;
  ulong local_60;
  undefined1 local_58 [8];
  quintptr qStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  auVar17._8_8_ = local_78.i;
  auVar17._0_8_ = local_78._0_8_;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (event[0xc] == (QDropEvent)0x0) {
    plVar1 = *(long **)&(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                        super_QWidgetPrivate.field_0x8;
    local_58 = (undefined1  [8])0xffffffffffffffff;
    qStack_50 = 0;
    local_48.ptr = (QAbstractItemModel *)0x0;
    pQVar2 = ((this->super_QAbstractScrollAreaPrivate).viewport)->data;
    iVar11 = (pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i;
    local_78.i = CONCAT44((pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i,iVar11);
    local_78.r = 0;
    local_78.c = 0;
    auVar18._0_8_ =
         (double)((ulong)*(double *)(event + 0x10) & 0x8000000000000000 | 0x3fe0000000000000) +
         *(double *)(event + 0x10);
    auVar18._8_8_ =
         (double)((ulong)*(double *)(event + 0x18) & 0x8000000000000000 | 0x3fe0000000000000) +
         *(double *)(event + 0x18);
    auVar17 = minpd(_DAT_0066f5d0,auVar18);
    auVar19._8_8_ = -(ulong)(-2147483648.0 < auVar17._8_8_);
    auVar19._0_8_ = -(ulong)(-2147483648.0 < auVar17._0_8_);
    local_60 = (ulong)(uint)(int)auVar17._0_8_;
    uVar12 = movmskpd(iVar11,auVar19);
    uVar13 = (ulong)(uint)(int)auVar17._8_8_ << 0x20;
    if ((uVar12 & 2) == 0) {
      uVar13 = 0x8000000000000000;
    }
    if ((uVar12 & 1) == 0) {
      local_60 = 0x80000000;
    }
    local_60 = local_60 | uVar13;
    cVar6 = QRect::contains((QPoint *)&local_78,SUB81(&local_60,0));
    if (cVar6 != '\0') {
      auVar20._0_8_ =
           (double)((ulong)*(double *)(event + 0x10) & 0x8000000000000000 | 0x3fe0000000000000) +
           *(double *)(event + 0x10);
      auVar20._8_8_ =
           (double)((ulong)*(double *)(event + 0x18) & 0x8000000000000000 | 0x3fe0000000000000) +
           *(double *)(event + 0x18);
      auVar17 = minpd(_DAT_0066f5d0,auVar20);
      auVar21._8_8_ = -(ulong)(-2147483648.0 < auVar17._8_8_);
      auVar21._0_8_ = -(ulong)(-2147483648.0 < auVar17._0_8_);
      uVar13 = (ulong)(uint)(int)auVar17._0_8_;
      uVar12 = movmskpd(uVar12,auVar21);
      uVar14 = (ulong)(uint)(int)auVar17._8_8_ << 0x20;
      if ((uVar12 & 2) == 0) {
        uVar14 = 0x8000000000000000;
      }
      if ((uVar12 & 1) == 0) {
        uVar13 = 0x80000000;
      }
      local_78._0_8_ = uVar13 | uVar14;
      (**(code **)(*plVar1 + 0x1f0))(local_58,plVar1);
      if ((((int)local_58._0_4_ < 0) || ((long)local_58 < 0)) ||
         (local_48.ptr == (QAbstractItemModel *)0x0)) {
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_78,&this->root);
        local_48.ptr = local_78.m.ptr;
        local_58._0_4_ = local_78.r;
        local_58._4_4_ = local_78.c;
        qStack_50 = local_78.i;
      }
    }
    uVar9 = (**(code **)(*(long *)this->model + 0xe8))();
    auVar17._8_8_ = local_78.i;
    auVar17._0_4_ = local_78.r;
    auVar17._4_4_ = local_78.c;
    if ((*(uint *)(event + 0x2c) & uVar9) != 0) {
      cVar6 = comparesEqual(&this->root,(QModelIndex *)local_58);
      auVar3._8_8_ = local_78.i;
      auVar3._0_4_ = local_78.r;
      auVar3._4_4_ = local_78.c;
      if (cVar6 == '\0') {
        auVar22._0_8_ =
             (double)((ulong)*(double *)(event + 0x10) & 0x8000000000000000 | 0x3fe0000000000000) +
             *(double *)(event + 0x10);
        auVar22._8_8_ =
             (double)((ulong)*(double *)(event + 0x18) & 0x8000000000000000 | 0x3fe0000000000000) +
             *(double *)(event + 0x18);
        auVar17 = minpd(_DAT_0066f5d0,auVar22);
        auVar23._8_8_ = -(ulong)(-2147483648.0 < auVar17._8_8_);
        auVar23._0_8_ = -(ulong)(-2147483648.0 < auVar17._0_8_);
        uVar12 = movmskpd(uVar12,auVar23);
        uVar13 = 0x8000000000000000;
        if ((uVar12 & 2) != 0) {
          uVar13 = (ulong)(uint)(int)auVar17._8_8_ << 0x20;
        }
        local_60 = 0x80000000;
        if ((uVar12 & 1) != 0) {
          local_60 = (ulong)(uint)(int)auVar17._0_8_;
        }
        local_60 = local_60 | uVar13;
        local_78._0_16_ = (**(code **)(*plVar1 + 0x1e0))(plVar1,local_58);
        DVar10 = (**(code **)(*(long *)&(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate
                                        .super_QWidgetPrivate + 0x120))
                           (this,&local_60,&local_78,local_58);
        auVar4._8_8_ = qStack_50;
        auVar4._0_8_ = local_58;
        this->dropIndicatorPosition = DVar10;
        iVar11 = local_58._0_4_;
        uVar5 = local_58._4_4_;
        if (DVar10 == BelowItem) {
          if (local_48.ptr == (QAbstractItemModel *)0x0) {
            local_78._0_16_ = ZEXT816(0xffffffffffffffff);
            local_78.m.ptr = (QAbstractItemModel *)0x0;
          }
          else {
            (**(code **)(*(long *)local_48.ptr + 0x68))(&local_78,local_48.ptr,local_58);
          }
          iVar11 = iVar11 + 1;
        }
        else {
          iVar15 = -1;
          iVar16 = -1;
          _local_58 = auVar4;
          if (DVar10 != AboveItem) goto LAB_0053f589;
          if (local_48.ptr == (QAbstractItemModel *)0x0) {
            local_78._0_16_ = ZEXT816(0xffffffffffffffff);
            local_78.m.ptr = (QAbstractItemModel *)0x0;
          }
          else {
            (**(code **)(*(long *)local_48.ptr + 0x68))(&local_78,local_48.ptr,local_58);
          }
        }
        local_48.ptr = local_78.m.ptr;
        iVar15 = iVar11;
        iVar16 = uVar5;
        _local_58 = (undefined1  [16])local_78._0_16_;
      }
      else {
        this->dropIndicatorPosition = OnViewport;
        iVar15 = -1;
        iVar16 = -1;
        local_78._0_16_ = auVar3;
      }
LAB_0053f589:
      (dropIndex->m).ptr = local_48.ptr;
      dropIndex->r = local_58._0_4_;
      dropIndex->c = local_58._4_4_;
      dropIndex->i = local_58._8_8_;
      *dropRow = iVar15;
      *dropCol = iVar16;
      bVar7 = droppingOnItself(this,event,(QModelIndex *)local_58);
      bVar8 = true;
      auVar17 = (undefined1  [16])local_78._0_16_;
      if (!bVar7) goto LAB_0053f5c3;
    }
  }
  bVar8 = false;
LAB_0053f5c3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar8;
  }
  local_78._0_16_ = auVar17;
  __stack_chk_fail();
}

Assistant:

bool QAbstractItemViewPrivate::dropOn(QDropEvent *event, int *dropRow, int *dropCol, QModelIndex *dropIndex)
{
    Q_Q(QAbstractItemView);
    if (event->isAccepted())
        return false;

    QModelIndex index;
    // rootIndex() (i.e. the viewport) might be a valid index
    if (viewport->rect().contains(event->position().toPoint())) {
        index = q->indexAt(event->position().toPoint());
        if (!index.isValid())
            index = root;
    }

    // If we are allowed to do the drop
    if (model->supportedDropActions() & event->dropAction()) {
        int row = -1;
        int col = -1;
        if (index != root) {
            dropIndicatorPosition = position(event->position().toPoint(), q->visualRect(index), index);
            switch (dropIndicatorPosition) {
            case QAbstractItemView::AboveItem:
                row = index.row();
                col = index.column();
                index = index.parent();
                break;
            case QAbstractItemView::BelowItem:
                row = index.row() + 1;
                col = index.column();
                index = index.parent();
                break;
            case QAbstractItemView::OnItem:
            case QAbstractItemView::OnViewport:
                break;
            }
        } else {
            dropIndicatorPosition = QAbstractItemView::OnViewport;
        }
        *dropIndex = index;
        *dropRow = row;
        *dropCol = col;
        if (!droppingOnItself(event, index))
            return true;
    }
    return false;
}